

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O1

void __thiscall
CASC_FILE_TREE::SetExtras
          (CASC_FILE_TREE *this,PCASC_FILE_NODE pFileNode,DWORD FileSize,DWORD LocaleId)

{
  if (this->FileSizeOffset != 0) {
    *(DWORD *)((pFileNode->CKey).Value + this->FileSizeOffset) = FileSize;
  }
  if (this->LocaleIdOffset != 0) {
    *(DWORD *)((pFileNode->CKey).Value + this->LocaleIdOffset) = LocaleId;
  }
  return;
}

Assistant:

void CASC_FILE_TREE::SetExtras(PCASC_FILE_NODE pFileNode, DWORD FileSize, DWORD LocaleId)
{
    // Set the file size, if supported
    if(FileSizeOffset != 0)
    {
        SET_NODE_INT32(pFileNode, FileSizeOffset, FileSize);
    }

    // Set the locale ID, if supported
    if(LocaleIdOffset != 0)
    {
        SET_NODE_INT32(pFileNode, LocaleIdOffset, LocaleId);
    }
}